

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPublicKey.cpp
# Opt level: O0

bool __thiscall EDPublicKey::deserialise(EDPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  long *in_RDI;
  ByteString dA;
  ByteString dEC;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar1 = ByteString::size((ByteString *)0x14ffd4);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x14fff0);
    if (sVar1 != 0) {
      (**(code **)(*in_RDI + 0x38))(in_RDI,local_40);
      (**(code **)(*in_RDI + 0x40))(in_RDI,local_68);
      local_1 = 1;
      goto LAB_00150078;
    }
  }
  local_1 = 0;
LAB_00150078:
  ByteString::~ByteString((ByteString *)0x150082);
  ByteString::~ByteString((ByteString *)0x15008c);
  return (bool)(local_1 & 1);
}

Assistant:

bool EDPublicKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dA = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dA.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setA(dA);

	return true;
}